

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O3

Ivy_Obj_t * Ivy_Maj(Ivy_Man_t *p,Ivy_Obj_t *pA,Ivy_Obj_t *pB,Ivy_Obj_t *pC)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  
  pIVar1 = Ivy_And(p,pA,pB);
  pIVar2 = Ivy_And(p,pA,pC);
  pIVar1 = Ivy_And(p,(Ivy_Obj_t *)((ulong)pIVar1 ^ 1),(Ivy_Obj_t *)((ulong)pIVar2 ^ 1));
  pIVar2 = Ivy_And(p,pB,pC);
  pIVar1 = Ivy_And(p,pIVar1,(Ivy_Obj_t *)((ulong)pIVar2 ^ 1));
  return (Ivy_Obj_t *)((ulong)pIVar1 ^ 1);
}

Assistant:

Ivy_Obj_t * Ivy_Maj( Ivy_Man_t * p, Ivy_Obj_t * pA, Ivy_Obj_t * pB, Ivy_Obj_t * pC )
{
    return Ivy_Or( p, Ivy_Or(p, Ivy_And(p, pA, pB), Ivy_And(p, pA, pC)), Ivy_And(p, pB, pC) );
}